

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

Parser * __thiscall
Catch::Clara::Parser::operator|(Parser *__return_storage_ptr__,Parser *this,Help *other)

{
  Parser local_70;
  
  Parser(&local_70,this);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::push_back
            (&local_70.m_options,&other->super_Opt);
  Parser(__return_storage_ptr__,&local_70);
  ~Parser(&local_70);
  return __return_storage_ptr__;
}

Assistant:

auto operator|(T const& other) const -> Parser {
                return Parser(*this) |= other;
            }